

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::UpdateSourceCodeInfo
          (OptionInterpreter *this,SourceCodeInfo *info)

{
  iterator this_00;
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  pointer pSVar5;
  size_type sVar6;
  reference pvVar7;
  pointer pSVar8;
  reference pSVar9;
  pointer prVar10;
  reference piVar11;
  iterator iVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d8;
  iterator rit;
  SourceCodeInfo_Location *replacement;
  iterator local_c0;
  iterator it;
  undefined1 local_a8 [8];
  iterator entry;
  int iStack_90;
  int j_1;
  size_t j;
  iterator iStack_80;
  bool loc_matches;
  iterator local_68;
  iterator loc;
  undefined1 local_58 [7];
  bool matched;
  vector<int,_std::allocator<int>_> pathv;
  undefined1 local_38 [7];
  bool copying;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> new_locs;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *locs;
  SourceCodeInfo *info_local;
  OptionInterpreter *this_local;
  
  bVar2 = absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::empty((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)&this->interpreted_paths_);
  if (!bVar2) {
    new_locs.super_RepeatedPtrFieldBase.arena_ = (Arena *)SourceCodeInfo::mutable_location(info);
    RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)local_38);
    pathv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_58);
    loc.it_._7_1_ = 0;
    local_68.it_ = (void **)RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::begin
                                      ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>
                                        *)new_locs.super_RepeatedPtrFieldBase.arena_);
    while( true ) {
      iStack_80 = RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::end
                            ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
                             new_locs.super_RepeatedPtrFieldBase.arena_);
      bVar2 = internal::operator!=(&local_68,&stack0xffffffffffffff80);
      if (!bVar2) break;
      if ((loc.it_._7_1_ & 1) == 0) {
LAB_0024db08:
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)local_58)
        ;
        entry.field_1._4_4_ = 0;
        while( true ) {
          uVar1 = entry.field_1._4_4_;
          pSVar5 = internal::RepeatedPtrIterator<google::protobuf::SourceCodeInfo_Location>::
                   operator->(&local_68);
          iVar3 = SourceCodeInfo_Location::path_size(pSVar5);
          if (iVar3 <= (int)uVar1) break;
          pSVar5 = internal::RepeatedPtrIterator<google::protobuf::SourceCodeInfo_Location>::
                   operator->(&local_68);
          entry.field_1._0_4_ = SourceCodeInfo_Location::path(pSVar5,entry.field_1._4_4_);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_58,
                     (value_type_conflict3 *)&entry.field_1);
          entry.field_1._4_4_ = entry.field_1._4_4_ + 1;
        }
        iVar12 = absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
                 ::find<std::vector<int,std::allocator<int>>>
                           ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
                             *)&this->interpreted_paths_,(key_arg<std::vector<int>_> *)local_58);
        entry.ctrl_ = (ctrl_t *)iVar12.field_1;
        local_a8 = (undefined1  [8])iVar12.ctrl_;
        iVar12 = absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::end((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                        *)&this->interpreted_paths_);
        it.it_ = (void **)iVar12.ctrl_;
        bVar2 = absl::lts_20240722::container_internal::operator==
                          ((iterator *)local_a8,(iterator *)&it);
        if (bVar2) {
          if ((pathv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._7_1_ & 1) != 0) {
            pSVar9 = internal::RepeatedPtrIterator<google::protobuf::SourceCodeInfo_Location>::
                     operator*(&local_68);
            pSVar8 = RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::Add
                               ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
                                local_38);
            SourceCodeInfo_Location::operator=(pSVar8,pSVar9);
          }
        }
        else {
          loc.it_._7_1_ = 1;
          if ((pathv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._7_1_ & 1) == 0) {
            pathv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._7_1_ = 1;
            iVar3 = RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::size
                              ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
                               new_locs.super_RepeatedPtrFieldBase.arena_);
            RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::Reserve
                      ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)local_38,iVar3
                      );
            local_c0.it_ = (void **)RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::
                                    begin((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>
                                           *)new_locs.super_RepeatedPtrFieldBase.arena_);
            while (bVar2 = internal::operator!=(&local_c0,&local_68), bVar2) {
              pSVar9 = internal::RepeatedPtrIterator<google::protobuf::SourceCodeInfo_Location>::
                       operator*(&local_c0);
              pSVar8 = RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::Add
                                 ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
                                  local_38);
              SourceCodeInfo_Location::operator=(pSVar8,pSVar9);
              internal::RepeatedPtrIterator<google::protobuf::SourceCodeInfo_Location>::operator++
                        (&local_c0,0);
            }
          }
          rit._M_current =
               (int *)RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::Add
                                ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
                                 local_38);
          pSVar9 = internal::RepeatedPtrIterator<google::protobuf::SourceCodeInfo_Location>::
                   operator*(&local_68);
          SourceCodeInfo_Location::operator=((SourceCodeInfo_Location *)rit._M_current,pSVar9);
          SourceCodeInfo_Location::clear_path((SourceCodeInfo_Location *)rit._M_current);
          prVar10 = absl::lts_20240722::container_internal::
                    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::iterator::operator->((iterator *)local_a8);
          local_d8._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin(&prVar10->second);
          while( true ) {
            prVar10 = absl::lts_20240722::container_internal::
                      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20240722::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::iterator::operator->((iterator *)local_a8);
            local_e0._M_current =
                 (int *)std::vector<int,_std::allocator<int>_>::end(&prVar10->second);
            bVar2 = __gnu_cxx::operator!=(&local_d8,&local_e0);
            this_00 = rit;
            if (!bVar2) break;
            piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&local_d8);
            SourceCodeInfo_Location::add_path
                      ((SourceCodeInfo_Location *)this_00._M_current,*piVar11);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&local_d8,0);
          }
        }
      }
      else {
        bVar2 = true;
        pSVar5 = internal::RepeatedPtrIterator<google::protobuf::SourceCodeInfo_Location>::
                 operator->(&local_68);
        iVar3 = SourceCodeInfo_Location::path_size(pSVar5);
        sVar6 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_58);
        if ((long)iVar3 < (long)sVar6) {
          bVar2 = false;
        }
        else {
          for (_iStack_90 = 0;
              sVar6 = std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)local_58), _iStack_90 < sVar6;
              _iStack_90 = _iStack_90 + 1) {
            pSVar5 = internal::RepeatedPtrIterator<google::protobuf::SourceCodeInfo_Location>::
                     operator->(&local_68);
            iVar4 = SourceCodeInfo_Location::path(pSVar5,iStack_90);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_58,_iStack_90);
            if (iVar4 != *pvVar7) {
              bVar2 = false;
              break;
            }
          }
        }
        if (!bVar2) {
          loc.it_._7_1_ = 0;
          goto LAB_0024db08;
        }
      }
      internal::RepeatedPtrIterator<google::protobuf::SourceCodeInfo_Location>::operator++
                (&local_68,0);
    }
    if ((pathv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._7_1_ & 1) != 0) {
      RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::operator=
                ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)
                 new_locs.super_RepeatedPtrFieldBase.arena_,
                 (RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)local_38);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
    RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *)local_38);
  }
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::UpdateSourceCodeInfo(
    SourceCodeInfo* info) {
  if (interpreted_paths_.empty()) {
    // nothing to do!
    return;
  }

  // We find locations that match keys in interpreted_paths_ and
  // 1) replace the path with the corresponding value in interpreted_paths_
  // 2) remove any subsequent sub-locations (sub-location is one whose path
  //    has the parent path as a prefix)
  //
  // To avoid quadratic behavior of removing interior rows as we go,
  // we keep a copy. But we don't actually copy anything until we've
  // found the first match (so if the source code info has no locations
  // that need to be changed, there is zero copy overhead).

  RepeatedPtrField<SourceCodeInfo_Location>* locs = info->mutable_location();
  RepeatedPtrField<SourceCodeInfo_Location> new_locs;
  bool copying = false;

  std::vector<int> pathv;
  bool matched = false;

  for (RepeatedPtrField<SourceCodeInfo_Location>::iterator loc = locs->begin();
       loc != locs->end(); loc++) {
    if (matched) {
      // see if this location is in the range to remove
      bool loc_matches = true;
      if (loc->path_size() < static_cast<int64_t>(pathv.size())) {
        loc_matches = false;
      } else {
        for (size_t j = 0; j < pathv.size(); j++) {
          if (loc->path(j) != pathv[j]) {
            loc_matches = false;
            break;
          }
        }
      }

      if (loc_matches) {
        // don't copy this row since it is a sub-location that we're removing
        continue;
      }

      matched = false;
    }

    pathv.clear();
    for (int j = 0; j < loc->path_size(); j++) {
      pathv.push_back(loc->path(j));
    }

    auto entry = interpreted_paths_.find(pathv);

    if (entry == interpreted_paths_.end()) {
      // not a match
      if (copying) {
        *new_locs.Add() = *loc;
      }
      continue;
    }

    matched = true;

    if (!copying) {
      // initialize the copy we are building
      copying = true;
      new_locs.Reserve(locs->size());
      for (RepeatedPtrField<SourceCodeInfo_Location>::iterator it =
               locs->begin();
           it != loc; it++) {
        *new_locs.Add() = *it;
      }
    }

    // add replacement and update its path
    SourceCodeInfo_Location* replacement = new_locs.Add();
    *replacement = *loc;
    replacement->clear_path();
    for (std::vector<int>::iterator rit = entry->second.begin();
         rit != entry->second.end(); rit++) {
      replacement->add_path(*rit);
    }
  }

  // if we made a changed copy, put it in place
  if (copying) {
    *locs = std::move(new_locs);
  }
}